

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::UniformCase::getActiveUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
          *basicUniformReportsDst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,deUint32 programGL)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *pTVar3;
  pointer pBVar4;
  GLint GVar5;
  GLsizei GVar6;
  _Alloc_hider __s2;
  pointer pcVar7;
  bool bVar8;
  GLenum GVar9;
  DataType dataType;
  deBool dVar10;
  int iVar11;
  size_t sVar12;
  char *pcVar13;
  long *plVar14;
  undefined8 *puVar15;
  TestError *this_00;
  long *plVar16;
  ulong *puVar17;
  pointer pcVar18;
  pointer pBVar19;
  CallLogWrapper *pCVar20;
  ulong uVar21;
  GLuint index;
  pointer pBVar22;
  uint uVar23;
  size_type *psVar24;
  long lVar25;
  GLint reportedSize;
  GLsizei reportedNameLength;
  GLint uniformMaxNameLength;
  CallLogWrapper *local_450;
  GLint numActiveUniforms;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  *local_440;
  GLenum reportedTypeGL;
  string reportedNameStr;
  long *local_408;
  undefined8 local_400;
  long local_3f8;
  undefined8 uStack_3f0;
  ulong *local_3e8;
  long local_3e0;
  ulong local_3d8;
  long lStack_3d0;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  vector<char,_std::allocator<char>_> nameBuffer;
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  long *local_348 [2];
  long local_338 [2];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  GLsizei local_308;
  GLint local_304;
  DataType local_300;
  GLuint local_2fc;
  ios_base local_2b0 [264];
  ostringstream s;
  ios_base local_138 [264];
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  numActiveUniforms = 0;
  uniformMaxNameLength = 0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_450 = &this->super_CallLogWrapper;
  local_440 = basicUniformReportsDst;
  glu::CallLogWrapper::glGetProgramiv(local_450,programGL,0x8b86,&numActiveUniforms);
  GVar9 = glu::CallLogWrapper::glGetError(local_450);
  glu::checkError(GVar9,"glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x4f5);
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Number of active uniforms reported: ",0x27);
  pCVar20 = local_450;
  std::ostream::operator<<(poVar1,numActiveUniforms);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  glu::CallLogWrapper::glGetProgramiv(pCVar20,programGL,0x8b87,&uniformMaxNameLength);
  GVar9 = glu::CallLogWrapper::glGetError(local_450);
  glu::checkError(GVar9,
                  "glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x4f7);
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Maximum uniform name length reported: ",0x29);
  std::ostream::operator<<(poVar1,uniformMaxNameLength);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  std::vector<char,_std::allocator<char>_>::resize(&nameBuffer,(long)uniformMaxNameLength);
  if (numActiveUniforms < 1) {
    bVar8 = true;
LAB_003796f2:
    pBVar22 = (basicUniformReportsRef->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(basicUniformReportsRef->
                                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar22) >> 4) *
            -0x55555555) {
      poVar1 = (ostringstream *)(local_328 + 8);
      lVar25 = 0;
      do {
        if (pBVar22[lVar25].isUsedInShader == true) {
          pBVar19 = (local_440->
                    super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (pBVar19 !=
              (local_440->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            do {
              iVar11 = std::__cxx11::string::compare((char *)pBVar19);
              pBVar4 = (local_440->
                       super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar11 == 0) {
                if (pBVar19 != pBVar4) goto LAB_003797fb;
                break;
              }
              pBVar19 = pBVar19 + 1;
            } while (pBVar19 != pBVar4);
          }
          local_328._0_8_ = pTVar3;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"// FAILURE: uniform with name ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,pBVar22[lVar25].name._M_dataplus._M_p,
                     pBVar22[lVar25].name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," was not reported by GL",0x17);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_2b0);
          bVar8 = false;
        }
LAB_003797fb:
        lVar25 = lVar25 + 1;
        pBVar22 = (basicUniformReportsRef->
                  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar25 < (int)((ulong)((long)(basicUniformReportsRef->
                                            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar22) >> 4) * -0x55555555);
    }
    if (nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return bVar8;
  }
  bVar8 = true;
  index = 0;
  pCVar20 = local_450;
LAB_00378ca0:
  reportedNameLength = 0;
  reportedSize = -1;
  reportedTypeGL = 0;
  glu::CallLogWrapper::glGetActiveUniform
            (pCVar20,programGL,index,uniformMaxNameLength,&reportedNameLength,&reportedSize,
             &reportedTypeGL,
             nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar9 = glu::CallLogWrapper::glGetError(pCVar20);
  glu::checkError(GVar9,
                  "glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x501);
  dataType = glu::getDataTypeFromGLType(reportedTypeGL);
  pcVar7 = nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  reportedNameStr._M_dataplus._M_p = (pointer)&reportedNameStr.field_2;
  if (nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    pcVar18 = (pointer)0x1;
  }
  else {
    sVar12 = strlen(nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pcVar18 = pcVar7 + sVar12;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&reportedNameStr,pcVar7,pcVar18);
  if (dataType == TYPE_LAST) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid uniform type","reportedType != glu::TYPE_LAST",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
               ,0x506);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Got name = ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,reportedNameStr._M_dataplus._M_p,
             CONCAT44(reportedNameStr._M_string_length._4_4_,(int)reportedNameStr._M_string_length))
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", name length = ",0x10);
  std::ostream::operator<<(poVar1,reportedNameLength);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", size = ",9);
  std::ostream::operator<<(poVar1,reportedSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", type = ",9);
  pcVar13 = glu::getDataTypeName(dataType);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)local_328 + 8 + (int)*(undefined8 *)(local_328._8_8_ - 0x18));
  }
  else {
    sVar12 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_328 + 8),pcVar13,sVar12);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
  std::ios_base::~ios_base(local_2b0);
  if (reportedNameLength != (int)reportedNameStr._M_string_length) {
    poVar1 = (ostringstream *)(local_328 + 8);
    local_328._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// FAILURE: wrong name length reported, should be ",0x32);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
    std::ios_base::~ios_base(local_2b0);
    bVar8 = false;
  }
  dVar10 = deStringBeginsWith(reportedNameStr._M_dataplus._M_p,"gl_");
  __s2 = reportedNameStr._M_dataplus;
  if (dVar10 == 0) {
    pBVar22 = (basicUniformReportsRef->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar23 = (int)((long)(basicUniformReportsRef->
                         super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar22 >> 4) *
             -0x55555555;
    if (0 < (int)uVar23) {
      sVar12 = CONCAT44(reportedNameStr._M_string_length._4_4_,(int)reportedNameStr._M_string_length
                       );
      psVar24 = &(pBVar22->name)._M_string_length;
      uVar21 = 0;
      do {
        if ((*psVar24 == sVar12) &&
           ((sVar12 == 0 ||
            (iVar11 = bcmp((((string *)(psVar24 + -1))->_M_dataplus)._M_p,__s2._M_p,sVar12),
            iVar11 == 0)))) {
          pBVar19 = (local_440->
                    super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (pBVar19 ==
              (local_440->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
              )._M_impl.super__Vector_impl_data._M_finish) goto LAB_003790ed;
          goto LAB_0037904d;
        }
        uVar21 = uVar21 + 1;
        psVar24 = psVar24 + 6;
      } while ((uVar23 & 0x7fffffff) != uVar21);
    }
    local_328._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_328 + 8),"// FAILURE: invalid non-built-in uniform name reported",
               0x36);
    pCVar20 = local_450;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00378fdf;
  }
  goto LAB_00379008;
  while (pBVar19 = pBVar19 + 1, pBVar19 != pBVar4) {
LAB_0037904d:
    iVar11 = std::__cxx11::string::compare((char *)pBVar19);
    pBVar4 = (local_440->
             super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11 == 0) {
      if (pBVar19 != pBVar4) {
        poVar1 = (ostringstream *)(local_328 + 8);
        local_328._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"// FAILURE: same uniform name reported twice",0x2c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_2b0);
        bVar8 = false;
      }
      break;
    }
  }
LAB_003790ed:
  GVar6 = reportedNameLength;
  GVar5 = reportedSize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,reportedNameStr._M_dataplus._M_p,(allocator<char> *)&s);
  local_308 = GVar6;
  local_304 = GVar5;
  local_300 = dataType;
  local_2fc = index;
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  ::emplace_back<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>
            (local_440,(BasicUniformReportGL *)local_328);
  pCVar20 = local_450;
  if ((TestLog *)local_328._0_8_ != (TestLog *)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
  }
  uVar21 = uVar21 & 0xffffffff;
  if (dataType != pBVar22[uVar21].type) {
    local_328._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_328 + 8),"// FAILURE: wrong type reported, should be ",0x2b);
    pcVar13 = glu::getDataTypeName(pBVar22[uVar21].type);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_328 + 8 + (int)*(undefined8 *)(local_328._8_8_ - 0x18));
    }
    else {
      sVar12 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_328 + 8),pcVar13,sVar12);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
    std::ios_base::~ios_base(local_2b0);
    bVar8 = false;
  }
  if ((pBVar22[uVar21].minSize <= reportedSize) && (reportedSize <= pBVar22[uVar21].maxSize))
  goto LAB_00379008;
  local_328._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_328 + 8),"// FAILURE: wrong size reported, should be ",0x2b);
  iVar11 = pBVar22[uVar21].minSize;
  iVar2 = pBVar22[uVar21].maxSize;
  if (iVar11 == iVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    std::ostream::operator<<((ostringstream *)&s,pBVar22[uVar21].minSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    std::ostream::operator<<((ostringstream *)&s,pBVar22[uVar21].minSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base(local_138);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x6458f4);
    local_368 = &local_358;
    plVar16 = plVar14 + 2;
    if ((long *)*plVar14 == plVar16) {
      local_358 = *plVar16;
      lStack_350 = plVar14[3];
    }
    else {
      local_358 = *plVar16;
      local_368 = (long *)*plVar14;
    }
    local_360 = plVar14[1];
    *plVar14 = (long)plVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_368);
    local_3e8 = &local_3d8;
    puVar17 = (ulong *)(plVar14 + 2);
    if ((ulong *)*plVar14 == puVar17) {
      local_3d8 = *puVar17;
      lStack_3d0 = plVar14[3];
    }
    else {
      local_3d8 = *puVar17;
      local_3e8 = (ulong *)*plVar14;
    }
    local_3e0 = plVar14[1];
    *plVar14 = (long)puVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    std::ostream::operator<<((ostringstream *)&s,pBVar22[uVar21].maxSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base(local_138);
    uVar21 = 0xf;
    if (local_3e8 != &local_3d8) {
      uVar21 = local_3d8;
    }
    if (uVar21 < (ulong)(local_380 + local_3e0)) {
      uVar21 = 0xf;
      if (local_388 != local_378) {
        uVar21 = local_378[0];
      }
      if (uVar21 < (ulong)(local_380 + local_3e0)) goto LAB_003794f4;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3e8);
    }
    else {
LAB_003794f4:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_388);
    }
    local_408 = &local_3f8;
    plVar14 = puVar15 + 2;
    if ((long *)*puVar15 == plVar14) {
      local_3f8 = *plVar14;
      uStack_3f0 = puVar15[3];
    }
    else {
      local_3f8 = *plVar14;
      local_408 = (long *)*puVar15;
    }
    local_400 = puVar15[1];
    *puVar15 = plVar14;
    puVar15[1] = 0;
    *(undefined1 *)plVar14 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_408);
    local_3c8 = &local_3b8;
    plVar16 = plVar14 + 2;
    if ((long *)*plVar14 == plVar16) {
      local_3b8 = *plVar16;
      lStack_3b0 = plVar14[3];
    }
    else {
      local_3b8 = *plVar16;
      local_3c8 = (long *)*plVar14;
    }
    local_3c0 = plVar14[1];
    *plVar14 = (long)plVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_328 + 8),(char *)local_3c8,local_3c0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8 + 1);
  }
  pCVar20 = local_450;
  if (iVar11 != iVar2) {
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_388 != local_378) {
      operator_delete(local_388,local_378[0] + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,local_358 + 1);
    }
    if (local_348[0] != local_338) {
      operator_delete(local_348[0],local_338[0] + 1);
    }
  }
LAB_00378fdf:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
  std::ios_base::~ios_base(local_2b0);
  bVar8 = false;
LAB_00379008:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)reportedNameStr._M_dataplus._M_p != &reportedNameStr.field_2) {
    operator_delete(reportedNameStr._M_dataplus._M_p,
                    reportedNameStr.field_2._M_allocated_capacity + 1);
  }
  index = index + 1;
  if (numActiveUniforms <= (int)index) goto LAB_003796f2;
  goto LAB_00378ca0;
}

Assistant:

bool UniformCase::getActiveUniforms (vector<BasicUniformReportGL>& basicUniformReportsDst, const vector<BasicUniformReportRef>& basicUniformReportsRef, const deUint32 programGL)
{
	TestLog&			log						= m_testCtx.getLog();
	GLint				numActiveUniforms		= 0;
	GLint				uniformMaxNameLength	= 0;
	vector<char>		nameBuffer;
	bool				success					= true;

	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms));
	log << TestLog::Message << "// Number of active uniforms reported: " << numActiveUniforms << TestLog::EndMessage;
	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength));
	log << TestLog::Message << "// Maximum uniform name length reported: " << uniformMaxNameLength << TestLog::EndMessage;
	nameBuffer.resize(uniformMaxNameLength);

	for (int unifNdx = 0; unifNdx < numActiveUniforms; unifNdx++)
	{
		GLsizei					reportedNameLength	= 0;
		GLint					reportedSize		= -1;
		GLenum					reportedTypeGL		= GL_NONE;

		GLU_CHECK_CALL(glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0]));

		const glu::DataType		reportedType		= glu::getDataTypeFromGLType(reportedTypeGL);
		const string			reportedNameStr		(&nameBuffer[0]);

		TCU_CHECK_MSG(reportedType != glu::TYPE_LAST, "Invalid uniform type");

		log << TestLog::Message << "// Got name = " << reportedNameStr << ", name length = " << reportedNameLength << ", size = " << reportedSize << ", type = " << glu::getDataTypeName(reportedType) << TestLog::EndMessage;

		if ((GLsizei)reportedNameStr.length() != reportedNameLength)
		{
			log << TestLog::Message << "// FAILURE: wrong name length reported, should be " << reportedNameStr.length() << TestLog::EndMessage;
			success = false;
		}

		if (!deStringBeginsWith(reportedNameStr.c_str(), "gl_")) // Ignore built-in uniforms.
		{
			int referenceNdx;
			for (referenceNdx = 0; referenceNdx < (int)basicUniformReportsRef.size(); referenceNdx++)
			{
				if (basicUniformReportsRef[referenceNdx].name == reportedNameStr)
					break;
			}

			if (referenceNdx >= (int)basicUniformReportsRef.size())
			{
				log << TestLog::Message << "// FAILURE: invalid non-built-in uniform name reported" << TestLog::EndMessage;
				success = false;
			}
			else
			{
				const BasicUniformReportRef& reference = basicUniformReportsRef[referenceNdx];

				DE_ASSERT(reference.type != glu::TYPE_LAST);
				DE_ASSERT(reference.minSize >= 1 || (reference.minSize == 0 && !reference.isUsedInShader));
				DE_ASSERT(reference.minSize <= reference.maxSize);

				if (BasicUniformReportGL::findWithName(basicUniformReportsDst, reportedNameStr.c_str()) != basicUniformReportsDst.end())
				{
					log << TestLog::Message << "// FAILURE: same uniform name reported twice" << TestLog::EndMessage;
					success = false;
				}

				basicUniformReportsDst.push_back(BasicUniformReportGL(reportedNameStr.c_str(), reportedNameLength, reportedSize, reportedType, unifNdx));

				if (reportedType != reference.type)
				{
					log << TestLog::Message << "// FAILURE: wrong type reported, should be " << glu::getDataTypeName(reference.type) << TestLog::EndMessage;
					success = false;
				}
				if (reportedSize < reference.minSize || reportedSize > reference.maxSize)
				{
					log << TestLog::Message
						<< "// FAILURE: wrong size reported, should be "
						<< (reference.minSize == reference.maxSize ? de::toString(reference.minSize) : "in the range [" + de::toString(reference.minSize) + ", " + de::toString(reference.maxSize) + "]")
						<< TestLog::EndMessage;

					success = false;
				}
			}
		}
	}

	for (int i = 0; i < (int)basicUniformReportsRef.size(); i++)
	{
		const BasicUniformReportRef& expected = basicUniformReportsRef[i];
		if (expected.isUsedInShader && BasicUniformReportGL::findWithName(basicUniformReportsDst, expected.name.c_str()) == basicUniformReportsDst.end())
		{
			log << TestLog::Message << "// FAILURE: uniform with name " << expected.name << " was not reported by GL" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}